

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O3

hrgls_Status hrgls_APICreateParametersDestroy(hrgls_APICreateParams params)

{
  pointer puVar1;
  pointer pcVar2;
  
  if (params != (hrgls_APICreateParams)0x0) {
    puVar1 = (params->credentials).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    pcVar2 = (params->name)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(params->name).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(params);
    return 0;
  }
  return 0x3ec;
}

Assistant:

hrgls_Status hrgls_APICreateParametersDestroy(hrgls_APICreateParams params)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_DELETE_OF_NULL_POINTER;
    }
    try {
      delete params;
    } catch (...) {
      s = hrgls_STATUS_DELETION_FAILED;
    }
    return s;
  }